

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmpset.cpp
# Opt level: O1

void __thiscall icu_63::BMPSet::overrideIllegal(BMPSet *this)

{
  long lVar1;
  
  if (this->containsFFFD == '\0') {
    lVar1 = 0;
    do {
      this->bmpBlockBits[lVar1 + 0x20] = this->bmpBlockBits[lVar1 + 0x20] & 0xdfffdfff;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x20);
  }
  else {
    lVar1 = 0;
    do {
      *(byte *)(this->table7FF + lVar1) = (byte)this->table7FF[lVar1] | 3;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x40);
    lVar1 = 0;
    do {
      *(byte *)(this->bmpBlockBits + lVar1) = (byte)this->bmpBlockBits[lVar1] | 1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x20);
    lVar1 = 0;
    do {
      this->bmpBlockBits[lVar1 + 0x20] = this->bmpBlockBits[lVar1 + 0x20] & 0xdfffdfff | 0x2000;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x20);
  }
  return;
}

Assistant:

void BMPSet::overrideIllegal() {
    uint32_t bits, mask;
    int32_t i;

    if(containsFFFD) {
        bits=3;                 // Lead bytes 0xC0 and 0xC1.
        for(i=0; i<64; ++i) {
            table7FF[i]|=bits;
        }

        bits=1;                 // Lead byte 0xE0.
        for(i=0; i<32; ++i) {   // First half of 4k block.
            bmpBlockBits[i]|=bits;
        }

        mask= static_cast<uint32_t>(~(0x10001<<0xd));   // Lead byte 0xED.
        bits=1<<0xd;
        for(i=32; i<64; ++i) {  // Second half of 4k block.
            bmpBlockBits[i]=(bmpBlockBits[i]&mask)|bits;
        }
    } else {
        mask= static_cast<uint32_t>(~(0x10001<<0xd));   // Lead byte 0xED.
        for(i=32; i<64; ++i) {  // Second half of 4k block.
            bmpBlockBits[i]&=mask;
        }
    }
}